

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

void __thiscall Chip8::CPU::run_cycle(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  byte bVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  ostream *this_00;
  long *plVar8;
  ushort uVar9;
  uint uVar10;
  int i;
  uint uVar11;
  int iVar12;
  int j;
  uint uVar13;
  int x;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  SDL_Event event;
  int local_68 [5];
  int local_54;
  
  bVar1 = Memory::getByte(this->_m,(uint)this->_program_counter);
  bVar2 = Memory::getByte(this->_m,this->_program_counter + 1);
  uVar11 = (uint)CONCAT11(bVar1,bVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Operation at 0x",0xf);
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  this_00 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," -> ",4);
  *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 4;
  plVar8 = (long *)std::ostream::operator<<(this_00,uVar11);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  if (0xf < bVar1 >> 4) goto switchD_00102ab2_caseD_9;
  uVar9 = CONCAT11(bVar1,bVar2) & 0xfff;
  uVar13 = bVar1 & 0xf;
  bVar15 = bVar2 >> 4;
  uVar10 = (uint)bVar2;
  switch(bVar1 >> 4) {
  case 0:
    if (uVar11 == 0xee) {
      this->_program_counter = this->_stack_pointer;
    }
    else if (uVar11 == 0xe0) {
      Graphics::clear(this->_g);
    }
    else {
      Memory::dump(this->_m);
    }
    goto switchD_00102ab2_caseD_9;
  case 1:
    goto switchD_00102ab2_caseD_1;
  case 2:
    this->_stack_pointer = this->_program_counter + 2;
    goto switchD_00102ab2_caseD_1;
  case 3:
    uVar6 = this->_program_counter;
    if (this->_registers[uVar13] == bVar2) goto LAB_00102d06;
LAB_00102b51:
    uVar6 = uVar6 + 2;
    goto LAB_00102d09;
  case 4:
    uVar6 = this->_program_counter;
    if (this->_registers[uVar13] == bVar2) goto LAB_00102b51;
LAB_00102d06:
    uVar6 = uVar6 + 4;
LAB_00102d09:
    this->_program_counter = uVar6;
    goto switchD_00102ab2_caseD_9;
  case 5:
    if (this->_registers[uVar13] == this->_registers[bVar15]) {
      uVar9 = this->_program_counter + 4;
    }
    else {
      uVar9 = this->_program_counter + 2;
    }
switchD_00102ab2_caseD_1:
    this->_program_counter = uVar9;
    goto switchD_00102ab2_caseD_9;
  case 6:
    this->_registers[uVar13] = bVar2;
    break;
  case 7:
    this->_registers[uVar13] = this->_registers[uVar13] + bVar2;
    break;
  case 8:
    switch(uVar10 & 0xf) {
    case 0:
      bVar1 = this->_registers[bVar15];
      goto LAB_00102e9e;
    case 1:
      this->_registers[uVar13] = this->_registers[uVar13] | this->_registers[bVar15];
      break;
    case 2:
      this->_registers[uVar13] = this->_registers[uVar13] & this->_registers[bVar15];
      break;
    case 3:
      this->_registers[uVar13] = this->_registers[uVar13] ^ this->_registers[bVar15];
      break;
    case 4:
      uVar11 = (uint)this->_registers[bVar15] + (uint)this->_registers[uVar13];
      this->_registers[0xf] = 0xff < uVar11;
      this->_registers[uVar13] = (uint8_t)((ulong)uVar11 * 0x101010102 >> 0x20);
      break;
    case 5:
      this->_registers[0xf] = this->_registers[bVar15] <= this->_registers[uVar13];
      this->_registers[uVar13] = this->_registers[uVar13] - this->_registers[bVar15];
      break;
    case 6:
      this->_registers[0xf] = this->_registers[bVar15] & 1;
      bVar1 = this->_registers[bVar15] >> 1;
      goto LAB_00102e9e;
    case 7:
      this->_registers[0xf] = this->_registers[uVar13] <= this->_registers[bVar15];
      bVar1 = this->_registers[bVar15] - this->_registers[uVar13];
      goto LAB_00102e9e;
    case 0xe:
      this->_registers[0xf] = '\0';
      bVar1 = this->_registers[bVar15] * '\x02';
LAB_00102e9e:
      this->_registers[uVar13] = bVar1;
    }
    break;
  default:
    goto switchD_00102ab2_caseD_9;
  case 10:
switchD_00102ab2_caseD_a:
    this->_index_register = uVar9;
    break;
  case 0xc:
    iVar7 = rand();
    this->_registers[uVar13] = bVar2 & (byte)iVar7;
    break;
  case 0xd:
    uVar11 = 0;
    if ((bVar2 & 0xf) != 0) {
      bVar1 = this->_registers[uVar13];
      bVar2 = this->_registers[bVar15];
      uVar9 = this->_index_register;
      bVar15 = 0;
      bVar16 = 0;
      do {
        bVar4 = Memory::getByte(this->_m,uVar11 + uVar9);
        iVar7 = uVar11 + bVar2;
        uVar13 = 0x80;
        iVar12 = 0;
        do {
          if ((bVar4 & uVar13) != 0) {
            x = (uint)bVar1 + iVar12;
            bVar5 = Graphics::get(this->_g,x,iVar7);
            bVar16 = bVar15;
            if (bVar5) {
              bVar16 = 1;
            }
            Graphics::set(this->_g,x,iVar7,!bVar5);
            bVar15 = bVar16;
          }
          uVar13 = uVar13 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar10 & 0xf));
      uVar11 = (uint)bVar16;
    }
    this->_registers[0xf] = (uint8_t)uVar11;
    break;
  case 0xe:
    if (bVar2 == 0xa1) {
      bVar1 = this->_registers[uVar13];
      iVar7 = SDL_PollEvent(local_68);
      if (iVar7 != 0) {
        do {
          if ((local_68[0] == 0x300) && (local_54 == *(int *)(kKeyCodeMap + (ulong)bVar1 * 4))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping",8);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
            std::ostream::put(' ');
            std::ostream::flush();
            this->_program_counter = this->_program_counter + 2;
          }
          iVar7 = SDL_PollEvent(local_68);
        } while (iVar7 != 0);
      }
    }
    break;
  case 0xf:
    if (bVar2 < 0x29) {
      if (uVar10 == 7) {
        bVar1 = this->_delay_timer;
        goto LAB_00102e9e;
      }
      if (uVar10 == 0x15) {
        this->_delay_timer = this->_registers[uVar13];
      }
    }
    else {
      if (uVar10 == 0x29) {
        uVar6 = Memory::getFontLocation(this->_m);
        uVar9 = this->_registers[uVar13] + uVar6;
        goto switchD_00102ab2_caseD_a;
      }
      if (uVar10 == 0x33) {
        iVar7 = 100;
        iVar12 = 0;
        do {
          Memory::putByte(this->_m,(uint)this->_index_register + iVar12,
                          (uint8_t)((long)(ulong)this->_registers[uVar13] % (long)iVar7));
          iVar7 = iVar7 / 10;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 3);
      }
      else if (uVar10 == 0x65) {
        uVar14 = 0;
        do {
          uVar3 = Memory::getByte(this->_m,(uint)this->_index_register + (int)uVar14);
          this->_registers[uVar14] = uVar3;
          uVar14 = uVar14 + 1;
        } while ((byte)((char)uVar13 + 1) != uVar14);
      }
    }
  }
  this->_program_counter = this->_program_counter + 2;
switchD_00102ab2_caseD_9:
  dump(this);
  if (this->_delay_timer != '\0') {
    this->_delay_timer = this->_delay_timer + 0xff;
  }
  if (this->_sound_timer != '\0') {
    this->_sound_timer = this->_sound_timer + 0xff;
  }
  return;
}

Assistant:

void CPU::run_cycle() {
        // Decode instruction
        OpCode op = _m->getByte(_program_counter) << 8 | _m->getByte(_program_counter + 1);

        std::cout << "Operation at 0x"
            << std::hex << _program_counter << " -> " << std::setw(4) << int(op)
            << std::endl;

        Address a = op & kAddressMask;
        uint8_t rx = (op & kRegisterXMask) >> 8;
        uint8_t ry = (op & kRegisterYMask) >> 4;
        uint8_t last_byte = op & 0x0FF;

        // Run instruction
        switch (op & kOpCodeMask) {
            case 0x0000:
                if (op == 0x00E0)
                    // Clear the screen
                    _g->clear();
                else if (op == 0x00EE)
                    // Return from subroutine
                    _program_counter = _stack_pointer;
                else
                    _m->dump();
                break;

            case 0x1000:
                _program_counter = a;
                break;

            case 0x2000:
                _stack_pointer = _program_counter + 2;
                _program_counter = op & 0x0FFF;
                break;

            case 0x3000:
                if (_registers[rx] == (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x4000:
                if (_registers[rx] != (op & kImmediateMask))
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x5000:
                if (_registers[rx] == _registers[ry])
                    _program_counter += 4;
                else
                    _program_counter += 2;
                break;

            case 0x6000:
                _registers[rx] = (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x7000:
                _registers[rx] += (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0x8000:
                switch (op & kLastNibble) {
                    case 0x0:
                        // Sets VX to the value of VY
                        _registers[rx] = _registers[ry];
                        break;
                    case 0x1:
                        // Sets VX to VX OR VY
                        _registers[rx] |= _registers[ry];
                        break;
                    case 0x2:
                        // Sets VX to VX AND VY
                        _registers[rx] &= _registers[ry];
                        break;
                    case 0x3:
                        // Sets VX to VX XOR VY
                        _registers[rx] ^= _registers[ry];
                        break;
                    case 0x4: {
                        // Adds VY to VX, VF is set to carry
                        uint16_t sum = _registers[rx] + _registers[ry];
                        _registers[0xF] = (sum > 0xFF) ? 1 : 0;
                        _registers[rx] = sum % 0xFF;
                        break;
                    }
                    case 0x5:
                        // VY is subtracted from VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[ry] > _registers[rx] ? 0 : 1);
                        _registers[rx] -= _registers[ry];
                        break;
                    case 0x6:
                        // Shifts VY right by one and stores the result in VX, VF set to least
                        // significant bit before shift
                        _registers[0xF] = _registers[ry] & 0x0001;
                        _registers[rx] = _registers[ry] >> 1;
                        break;
                    case 0x7:
                        // Sets VX to VY minus VX, VF is set to zero when there is a borrow
                        _registers[0xF] = (_registers[rx] > _registers[ry] ? 0 : 1);
                        _registers[rx] = _registers[ry] - _registers[rx];
                        break;
                    case 0xE:
                        // Shifts VY left by one and stores result in VX, VF set to most
                        // significant bit before shift
                        _registers[0xF] = (_registers[ry] & 0x8000) >> 8;
                        _registers[rx] = _registers[ry] << 1;
                        break;
                }
                _program_counter += 2;
                break;

            case 0xA000:
                _index_register = (op & kAddressMask);
                _program_counter += 2;
                break;

            case 0xC000:
                _registers[rx] = std::rand() & (op & kImmediateMask);
                _program_counter += 2;
                break;

            case 0xD000: {
                int x = _registers[rx];
                int y = _registers[ry];
                int n = (op & kLastNibble);

                uint16_t sprite_pointer = _index_register;
                bool xored = false;

                // Height is determined by the last nibble
                for (int i=0; i < n; i++) {

                    // Chip8 sprites are ALWAYS 8 pixels wide
                    uint8_t sprite_mask = 0x80;
                    uint8_t sprite_row = _m->getByte(sprite_pointer + i);

                    //std::cout << "[cpu] Current sprite pointer: " << (int)sprite_pointer + i << std::endl;
                    //std::cout << "[cpu] Current sprite row: " << (int)sprite_row << std::endl;

                    for (int j=0; j<8; j++) {
                        if (sprite_row & sprite_mask) {
                            bool on = _g->get(x + j, y + i);
                            if (on) xored = true;
                            _g->set(x + j, y + i, !on);
                        }
                        sprite_mask >>= 1;
                    }
                }

                _registers[0x0F] = xored;
                _program_counter += 2;
                break;
            }

            case 0xE000:
                switch (last_byte) {
                    case 0xA1: {
                        // Skip the following instruction if the key corresponding to the hex value
                        // currently stored in register VX is not pressed.
                        uint8_t key = _registers[rx];
                        SDL_Event event;
                        while (SDL_PollEvent(&event)) {
                            if (event.type == SDL_KEYDOWN) {
                                if(event.key.keysym.sym == kKeyCodeMap[key]) {
                                    std::cout << "skipping" << std::endl;
                                    _program_counter += 2;
                                }
                            }
                        }
                    }
                }
                _program_counter += 2;
                break;

            case 0xF000:
                int mod = 100;
                switch (last_byte) {
                    case 0x07:
                        // Store the current value of the delay timer in register VX
                        _registers[rx] = _delay_timer;
                        break;

                    case 0x15:
                        // Set the delay timer to the value of register VX
                        _delay_timer = _registers[rx];
                        break;

                    case 0x29:
                        // Set index register to location of font for hex digit in VX
                        _index_register = _m->getFontLocation() + _registers[rx];
                        break;

                    case 0x33:
                        // Store the binary-coded decimal equivalent of the value stored in
                        // register VX into subsequent memory addresses starting at the address
                        // currently in the index register.
                        for (int i=0; i<3; i++) {
                            _m->putByte(_index_register + i, _registers[rx] % mod);
                            mod /= 10;
                        }
                        break;

                    case 0x65:
                        // Fill registers V0 to VX inclusive with the values stored in memory
                        // starting at the address currently in the index register.
                        for (int i=0; i<=rx; i++)
                            _registers[i] = _m->getByte(_index_register + i);
                        break;
                        // TODO: set index register to index register + x + 1 after this?
                }
                _program_counter += 2;
        }

        // Lets check out what is going on inside the registers of the CPU
        dump();

        // Decrement the timers -- because the timers run at the same clock rate as the CPU
        // itself (60hz) this is totally fine.
        // TODO: skip decrement on cycle when timers are set
        if (_delay_timer > 0) {
            _delay_timer--;
        }

        if (_sound_timer > 0) {
            _sound_timer--;
        }
    }